

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_function_fe.h
# Opt level: O3

vector<double,_std::allocator<double>_> * __thiscall
lf::fe::MeshFunctionFE<double,_double>::operator()
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          MeshFunctionFE<double,_double> *this,Entity *e,MatrixXd *local)

{
  element_type *peVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar3;
  CoeffReturnType pdVar4;
  Scalar *pSVar5;
  long index;
  Matrix<double,_1,__1,_1,_1,__1> local_dofs;
  Matrix<double,__1,__1,_0,__1,__1> sf_eval;
  Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_> temp;
  PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> local_a8;
  double local_98;
  Rhs local_90;
  Product<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  local_78;
  Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_> local_68;
  Product<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  local_48;
  
  peVar1 = (this->fe_space_).
           super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  iVar2 = (*peVar1->_vptr_ScalarFESpace[2])(peVar1,e);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x38))
            (&local_90,(long *)CONCAT44(extraout_var,iVar2),local);
  local_a8.m_storage.m_data = (double *)0x0;
  local_a8.m_storage.m_cols = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::resize
            (&local_a8,1,
             local_90.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows);
  iVar2 = (*((this->fe_space_).
             super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_ScalarFESpace[1])();
  lVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x28))
                    ((long *)CONCAT44(extraout_var_00,iVar2),e);
  if (0 < local_90.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
     ) {
    index = 0;
    do {
      pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                          &this->dof_vector_,*(Index *)(lVar3 + index * 8));
      local_98 = *pdVar4;
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1> *)&local_a8,
                          index);
      *pSVar5 = local_98;
      index = index + 1;
    } while (index < local_90.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows);
  }
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,
             (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_cols,(allocator_type *)&local_68);
  Eigen::MapBase<Eigen::Map<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::Stride<0,_0>_>,_0>::
  MapBase((MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0> *
          )&local_68,
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_start,1,
          (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols
         );
  Eigen::
  Product<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
  Product(&local_78,(Lhs *)&local_a8,&local_90);
  local_48.m_lhs = local_78.m_lhs;
  local_48.m_rhs = local_78.m_rhs;
  Eigen::internal::
  call_assignment<Eigen::Map<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::Matrix<double,1,_1,1,1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::internal::assign_op<double,double>>
            (&local_68,&local_48,(assign_op<double,_double> *)&local_78,(type)0x0);
  free(local_a8.m_storage.m_data);
  free(local_90.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Scalar> operator()(const lf::mesh::Entity& e,
                                 const Eigen::MatrixXd& local) const {
    // Obtain values of all shape functions in the evaluation points
    auto sf_eval =
        fe_space_->ShapeFunctionLayout(e)->EvalReferenceShapeFunctions(local);
    // Extract the d.o.f.s for the current entity from the vector of global
    // d.o.f. values
    Eigen::Matrix<SCALAR_COEFF, 1, Eigen::Dynamic> local_dofs(1,
                                                              sf_eval.rows());
    auto global_dofs = fe_space_->LocGlobMap().GlobalDofIndices(e);
    for (Eigen::Index i = 0; i < sf_eval.rows(); ++i) {
      local_dofs(i) = dof_vector_(global_dofs[i]);
    }
    // Trick to combine Eigen data types with STL containers
    std::vector<Scalar> result(local.cols());
    Eigen::Map<Eigen::Matrix<Scalar, 1, Eigen::Dynamic>> temp(result.data(), 1,
                                                              local.cols());
    temp = local_dofs * sf_eval;
    return result;
  }